

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  u8 uVar1;
  u8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  FKey *p;
  sColMap *psVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Trigger *p_00;
  Schema *pSVar10;
  Select *pSVar11;
  long lVar12;
  long lVar13;
  Expr *local_e8;
  Select *local_e0;
  Expr *local_d0;
  TriggerStep *local_c0;
  ExprList *local_b0;
  int *aiCol;
  int local_94;
  int *local_90;
  ulong local_88;
  Index *pIdx;
  Token tOld;
  Token tToCol;
  Token tFromCol;
  Token tNew;
  
  if ((pParse->db->flags & 0x80000) != 0) {
    local_94 = regOld;
    p = sqlite3FkReferences(pTab);
    local_88 = (ulong)(pChanges != (ExprList *)0x0);
    local_90 = aChange;
    for (; p != (FKey *)0x0; p = p->pNextTo) {
      if ((aChange == (int *)0x0) ||
         (iVar5 = fkParentIsModified(pTab,p,aChange,bChngRowid), iVar5 != 0)) {
        uVar1 = p->aAction[local_88];
        p_00 = p->apTrigger[local_88];
        if (p_00 == (Trigger *)0x0 && uVar1 != '\0') {
          db = pParse->db;
          pIdx = (Index *)0x0;
          aiCol = (int *)0x0;
          iVar5 = sqlite3FkLocateIndex(pParse,pTab,p,&pIdx,&aiCol);
          if (iVar5 == 0) {
            lVar12 = 0;
            local_e8 = (Expr *)0x0;
            local_b0 = (ExprList *)0x0;
            local_d0 = (Expr *)0x0;
            for (lVar13 = 0; lVar13 < p->nCol; lVar13 = lVar13 + 1) {
              tOld.z = "old";
              tOld.n = 3;
              tOld._12_4_ = 0;
              psVar7 = (sColMap *)((long)aiCol + lVar12);
              if (aiCol == (int *)0x0) {
                psVar7 = p->aCol;
              }
              tNew.z = "new";
              tNew.n = 3;
              tNew._12_4_ = 0;
              tToCol.z = "oid";
              if (pIdx != (Index *)0x0) {
                tToCol.z = pTab->aCol[pIdx->aiColumn[lVar13]].zName;
              }
              iVar5 = psVar7->iFrom;
              pcVar3 = p->pFrom->aCol[iVar5].zName;
              tFromCol.z = pcVar3;
              tToCol.n = sqlite3Strlen30(tToCol.z);
              tFromCol.n = sqlite3Strlen30(pcVar3);
              pEVar8 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tOld);
              pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tToCol);
              pEVar8 = sqlite3PExpr(pParse,0x7a,pEVar8,pEVar9,(Token *)0x0);
              pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tFromCol);
              pEVar8 = sqlite3PExpr(pParse,0x4f,pEVar8,pEVar9,(Token *)0x0);
              local_e8 = sqlite3ExprAnd(db,local_e8,pEVar8);
              if (pChanges != (ExprList *)0x0) {
                pEVar8 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tOld);
                pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tToCol);
                pEVar8 = sqlite3PExpr(pParse,0x7a,pEVar8,pEVar9,(Token *)0x0);
                pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tNew);
                pRight = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tToCol);
                pEVar9 = sqlite3PExpr(pParse,0x7a,pEVar9,pRight,(Token *)0x0);
                pEVar8 = sqlite3PExpr(pParse,0x49,pEVar8,pEVar9,(Token *)0x0);
                local_d0 = sqlite3ExprAnd(db,local_d0,pEVar8);
              }
              if ((uVar1 != '\t' || pChanges != (ExprList *)0x0) && uVar1 != '\x06') {
                if (uVar1 == '\b') {
                  pEVar8 = p->pFrom->aCol[iVar5].pDflt;
                  if (pEVar8 == (Expr *)0x0) goto LAB_0015d57d;
                  pEVar8 = sqlite3ExprDup(db,pEVar8,0);
                }
                else {
                  if (uVar1 == '\t') {
                    pEVar8 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tNew);
                    pEVar9 = sqlite3PExpr(pParse,0x1b,(Expr *)0x0,(Expr *)0x0,&tToCol);
                    iVar5 = 0x7a;
                  }
                  else {
LAB_0015d57d:
                    iVar5 = 0x65;
                    pEVar8 = (Expr *)0x0;
                    pEVar9 = (Expr *)0x0;
                  }
                  pEVar8 = sqlite3PExpr(pParse,iVar5,pEVar8,pEVar9,(Token *)0x0);
                }
                local_b0 = sqlite3ExprListAppend(pParse,local_b0,pEVar8);
                sqlite3ExprListSetName(pParse,local_b0,&tFromCol,0);
              }
              lVar12 = lVar12 + 4;
            }
            sqlite3DbFree(db,aiCol);
            pcVar3 = p->pFrom->zName;
            uVar6 = sqlite3Strlen30(pcVar3);
            if (uVar1 == '\x06') {
              tOld.n = uVar6;
              tOld.z = pcVar3;
              pEVar8 = sqlite3Expr(db,0x39,"FOREIGN KEY constraint failed");
              aChange = local_90;
              if (pEVar8 != (Expr *)0x0) {
                pEVar8->affinity = '\x02';
              }
              pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar8);
              pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,&tOld,(Token *)0x0);
              local_e0 = sqlite3SelectNew(pParse,pEList,pSrc,local_e8,(ExprList *)0x0,(Expr *)0x0,
                                          (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
              local_e8 = (Expr *)0x0;
            }
            else {
              local_e0 = (Select *)0x0;
              aChange = local_90;
            }
            uVar2 = (db->lookaside).bEnabled;
            (db->lookaside).bEnabled = '\0';
            p_00 = (Trigger *)sqlite3DbMallocZero(db,(ulong)uVar6 + 0x99);
            if (p_00 == (Trigger *)0x0) {
              local_c0 = (TriggerStep *)0x0;
            }
            else {
              local_c0 = (TriggerStep *)(p_00 + 1);
              p_00->step_list = local_c0;
              p_00[1].pWhen = (Expr *)&p_00[2].table;
              *(uint *)&p_00[1].pColumns = uVar6;
              memcpy(&p_00[2].table,pcVar3,(ulong)uVar6);
              pSVar10 = (Schema *)sqlite3ExprDup(db,local_e8,1);
              p_00[1].pSchema = pSVar10;
              pSVar10 = (Schema *)sqlite3ExprListDup(db,local_b0,1);
              p_00[1].pTabSchema = pSVar10;
              pSVar11 = sqlite3SelectDup(db,local_e0,1);
              *(Select **)&p_00[1].op = pSVar11;
              if (local_d0 == (Expr *)0x0) {
                local_d0 = (Expr *)0x0;
              }
              else {
                local_d0 = sqlite3PExpr(pParse,0x13,local_d0,(Expr *)0x0,(Token *)0x0);
                pEVar8 = sqlite3ExprDup(db,local_d0,1);
                p_00->pWhen = pEVar8;
              }
            }
            (db->lookaside).bEnabled = uVar2;
            sqlite3ExprDelete(db,local_e8);
            sqlite3ExprDelete(db,local_d0);
            sqlite3ExprListDelete(db,local_b0);
            sqlite3SelectDelete(db,local_e0);
            if (db->mallocFailed != '\x01') {
              if (uVar1 == '\x06') {
                uVar4 = 0x77;
              }
              else if ((uVar1 == '\t') && (pChanges == (ExprList *)0x0)) {
                uVar4 = 0x6d;
              }
              else {
                uVar4 = 0x6e;
              }
              local_c0->op = uVar4;
              local_c0->pTrig = p_00;
              pSVar10 = pTab->pSchema;
              p_00->pSchema = pSVar10;
              p_00->pTabSchema = pSVar10;
              p->apTrigger[local_88] = p_00;
              p_00->op = (pChanges != (ExprList *)0x0) + 'm';
              goto LAB_0015d85a;
            }
            fkTriggerDelete(db,p_00);
          }
        }
        else if (p_00 != (Trigger *)0x0) {
LAB_0015d85a:
          sqlite3CodeRowTriggerDirect(pParse,p_00,pTab,local_94,2,0);
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}